

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::DecimalQuantity::operator==(DecimalQuantity *this,DecimalQuantity *other)

{
  int8_t iVar1;
  int8_t iVar2;
  int32_t iVar3;
  bool bVar4;
  bool local_39;
  int local_28;
  int m;
  bool basicEquals;
  DecimalQuantity *other_local;
  DecimalQuantity *this_local;
  
  bVar4 = false;
  if (((((this->scale == other->scale) && (bVar4 = false, this->precision == other->precision)) &&
       (bVar4 = false, this->flags == other->flags)) &&
      ((bVar4 = false, this->lOptPos == other->lOptPos &&
       (bVar4 = false, this->lReqPos == other->lReqPos)))) &&
     ((bVar4 = false, this->rReqPos == other->rReqPos &&
      (bVar4 = false, this->rOptPos == other->rOptPos)))) {
    bVar4 = this->isApproximate == other->isApproximate;
  }
  if (bVar4) {
    if (this->precision == 0) {
      this_local._7_1_ = true;
    }
    else if (this->isApproximate == '\0') {
      for (local_28 = getUpperDisplayMagnitude(this); iVar3 = getLowerDisplayMagnitude(this),
          iVar3 <= local_28; local_28 = local_28 + -1) {
        iVar1 = getDigit(this,local_28);
        iVar2 = getDigit(other,local_28);
        if (iVar1 != iVar2) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      local_39 = false;
      if ((this->origDouble == other->origDouble) &&
         (!NAN(this->origDouble) && !NAN(other->origDouble))) {
        local_39 = this->origDelta == other->origDelta;
      }
      this_local._7_1_ = local_39;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DecimalQuantity::operator==(const DecimalQuantity& other) const {
    bool basicEquals =
            scale == other.scale
            && precision == other.precision
            && flags == other.flags
            && lOptPos == other.lOptPos
            && lReqPos == other.lReqPos
            && rReqPos == other.rReqPos
            && rOptPos == other.rOptPos
            && isApproximate == other.isApproximate;
    if (!basicEquals) {
        return false;
    }

    if (precision == 0) {
        return true;
    } else if (isApproximate) {
        return origDouble == other.origDouble && origDelta == other.origDelta;
    } else {
        for (int m = getUpperDisplayMagnitude(); m >= getLowerDisplayMagnitude(); m--) {
            if (getDigit(m) != other.getDigit(m)) {
                return false;
            }
        }
        return true;
    }
}